

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O2

void __thiscall leveldb::Iterator::~Iterator(Iterator *this)

{
  CleanupFunction p_Var1;
  CleanupNode *pCVar2;
  CleanupNode *pCVar3;
  
  this->_vptr_Iterator = (_func_int **)&PTR__Iterator_00116cb0;
  p_Var1 = (this->cleanup_head_).function;
  if (p_Var1 != (CleanupFunction)0x0) {
    (*p_Var1)((this->cleanup_head_).arg1,(this->cleanup_head_).arg2);
    pCVar3 = (this->cleanup_head_).next;
    while (pCVar3 != (CleanupNode *)0x0) {
      (*pCVar3->function)(pCVar3->arg1,pCVar3->arg2);
      pCVar2 = pCVar3->next;
      operator_delete(pCVar3,0x20);
      pCVar3 = pCVar2;
    }
  }
  return;
}

Assistant:

Iterator::~Iterator() {
  if (!cleanup_head_.IsEmpty()) {
    cleanup_head_.Run();
    for (CleanupNode* node = cleanup_head_.next; node != nullptr;) {
      node->Run();
      CleanupNode* next_node = node->next;
      delete node;
      node = next_node;
    }
  }
}